

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::push(CTcTokenizer *this,CTcToken *tok)

{
  void *pvVar1;
  CTcTokenEle *pCVar2;
  CTcToken *in_RSI;
  long in_RDI;
  CTcTokenEle *newele;
  CTcTokenEle *in_stack_ffffffffffffffc0;
  
  if (*(long *)(in_RDI + 0xd18) == 0) {
    pvVar1 = operator_new(0x38);
    CTcTokenEle::CTcTokenEle(in_stack_ffffffffffffffc0);
    *(void **)(in_RDI + 0xd18) = pvVar1;
  }
  if (*(long *)(in_RDI + 0xd20) == 0) {
    *(undefined8 *)(in_RDI + 0xd20) = *(undefined8 *)(in_RDI + 0xd18);
  }
  else {
    pCVar2 = CTcTokenEle::getnxt(*(CTcTokenEle **)(in_RDI + 0xd20));
    if (pCVar2 == (CTcTokenEle *)0x0) {
      pCVar2 = (CTcTokenEle *)operator_new(0x38);
      CTcTokenEle::CTcTokenEle(pCVar2);
      CTcTokenEle::setnxt(*(CTcTokenEle **)(in_RDI + 0xd20),pCVar2);
      CTcTokenEle::setprv(pCVar2,*(CTcTokenEle **)(in_RDI + 0xd20));
      *(CTcTokenEle **)(in_RDI + 0xd20) = pCVar2;
    }
    else {
      pCVar2 = CTcTokenEle::getnxt(*(CTcTokenEle **)(in_RDI + 0xd20));
      *(CTcTokenEle **)(in_RDI + 0xd20) = pCVar2;
    }
  }
  CTcToken::set(*(CTcToken **)(in_RDI + 0xd20),in_RSI);
  return;
}

Assistant:

void CTcTokenizer::push(const CTcToken *tok)
{
    /* if the unget list is empty, create the initial entry */
    if (unget_head_ == 0)
        unget_head_ = new CTcTokenEle();

    /* advance to the next slot in the list */
    if (unget_cur_ == 0)
    {
        /* no last ungot token - set up at the head of the list */
        unget_cur_ = unget_head_;
    }
    else if (unget_cur_->getnxt() != 0)
    {
        /* there's another slot available - advance to it */
        unget_cur_ = unget_cur_->getnxt();
    }
    else
    {
        /* the list is full - we need to allocate a new slot */
        CTcTokenEle *newele = new CTcTokenEle();

        /* link it at the end of the list */
        unget_cur_->setnxt(newele);
        newele->setprv(unget_cur_);

        /* advance to it */
        unget_cur_ = newele;
    }

    /* save the pushed token */
    unget_cur_->set(*tok);
}